

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O1

UText * utext_close_63(UText *ut)

{
  uint uVar1;
  UTextClose *pUVar2;
  
  if (((ut != (UText *)0x0) && (ut->magic == 0x345ad82c)) && ((ut->flags & 4) != 0)) {
    pUVar2 = ut->pFuncs->close;
    if (pUVar2 != (UTextClose *)0x0) {
      (*pUVar2)(ut);
    }
    uVar1 = ut->flags;
    ut->flags = uVar1 & 0xfffffffb;
    if ((uVar1 & 2) != 0) {
      uprv_free_63(ut->pExtra);
      ut->pExtra = (void *)0x0;
      *(byte *)&ut->flags = (byte)ut->flags & 0xfd;
      ut->extraSize = 0;
    }
    ut->pFuncs = (UTextFuncs *)0x0;
    if ((ut->flags & 1) != 0) {
      ut->magic = 0;
      uprv_free_63(ut);
      ut = (UText *)0x0;
    }
  }
  return ut;
}

Assistant:

U_CAPI UText * U_EXPORT2
utext_close(UText *ut) {
    if (ut==NULL ||
        ut->magic != UTEXT_MAGIC ||
        (ut->flags & UTEXT_OPEN) == 0)
    {
        // The supplied ut is not an open UText.
        // Do nothing.
        return ut;
    }

    // If the provider gave us a close function, call it now.
    // This will clean up anything allocated specifically by the provider.
    if (ut->pFuncs->close != NULL) {
        ut->pFuncs->close(ut);
    }
    ut->flags &= ~UTEXT_OPEN;

    // If we (the framework) allocated the UText or subsidiary storage,
    //   delete it.
    if (ut->flags & UTEXT_EXTRA_HEAP_ALLOCATED) {
        uprv_free(ut->pExtra);
        ut->pExtra = NULL;
        ut->flags &= ~UTEXT_EXTRA_HEAP_ALLOCATED;
        ut->extraSize = 0;
    }

    // Zero out function table of the closed UText.  This is a defensive move,
    //   inteded to cause applications that inadvertantly use a closed
    //   utext to crash with null pointer errors.
    ut->pFuncs        = NULL;

    if (ut->flags & UTEXT_HEAP_ALLOCATED) {
        // This UText was allocated by UText setup.  We need to free it.
        // Clear magic, so we can detect if the user messes up and immediately
        //  tries to reopen another UText using the deleted storage.
        ut->magic = 0;
        uprv_free(ut);
        ut = NULL;
    }
    return ut;
}